

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

FOTerm * test_create_program(void)

{
  string *vname;
  undefined1 auVar1 [16];
  long lVar2;
  FOTerm *in_RDI;
  ulong in_R8;
  long *plVar3;
  initializer_list<FOTerm> params;
  initializer_list<FOTerm> params_00;
  initializer_list<FOTerm> params_01;
  initializer_list<FOTerm> params_02;
  undefined1 local_350 [8];
  FOTerm X;
  FOTerm a;
  FOTerm fa;
  FOTerm fX;
  FOTerm hYfa;
  long local_200;
  string local_1f0;
  long *local_1d0 [2];
  long local_1c0 [2];
  vector<FOTerm,_std::allocator<FOTerm>_> local_1b0;
  undefined4 local_198;
  long *local_190 [2];
  long local_180 [2];
  vector<FOTerm,_std::allocator<FOTerm>_> local_170;
  undefined4 local_158;
  long *local_150 [2];
  long local_140 [2];
  undefined1 local_130 [8];
  FOTerm Y;
  long local_e0;
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  vname = (string *)((long)&hYfa.name.field_2 + 8);
  hYfa.name.field_2._8_8_ = &stack0xfffffffffffffe00;
  std::__cxx11::string::_M_construct<char_const*>((string *)vname,"X","");
  FOTerm::variable((FOTerm *)local_350,vname);
  if ((long *)hYfa.name.field_2._8_8_ != &stack0xfffffffffffffe00) {
    operator_delete((void *)hYfa.name.field_2._8_8_,local_200 + 1);
  }
  Y.name.field_2._8_8_ = &stack0xffffffffffffff20;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&Y.name.field_2 + 8),"Y","");
  FOTerm::variable((FOTerm *)local_130,(string *)((long)&Y.name.field_2 + 8));
  if ((long *)Y.name.field_2._8_8_ != &stack0xffffffffffffff20) {
    operator_delete((void *)Y.name.field_2._8_8_,local_e0 + 1);
  }
  local_d0._0_8_ = (pointer)(local_d0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"a","");
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_R8;
  FOTerm::functor((FOTerm *)((long)&X.name.field_2 + 8),(FOTerm *)local_d0,(string *)0x0,
                  (initializer_list<FOTerm>)(auVar1 << 0x40));
  if ((pointer)local_d0._0_8_ != (pointer)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_,
                    (ulong)((long)&(((vector<FOTerm,_std::allocator<FOTerm>_> *)local_d0._16_8_)->
                                   super__Vector_base<FOTerm,_std::allocator<FOTerm>_>)._M_impl.
                                   super__Vector_impl_data._M_start + 1));
  }
  local_b0._0_8_ = local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"f","");
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&local_1f0,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&X.name.field_2 + 8));
  local_1f0.field_2._8_4_ =
       a.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_;
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,a._24_8_,a.name._M_dataplus._M_p + a._24_8_);
  params._M_len = in_R8;
  params._M_array = (iterator)0x1;
  FOTerm::functor((FOTerm *)((long)&a.name.field_2 + 8),(FOTerm *)local_b0,&local_1f0,params);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&local_1f0);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"f","");
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&local_1f0,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)local_350);
  local_1f0.field_2._8_4_ =
       X.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_;
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,X._24_8_,X.name._M_dataplus._M_p + X._24_8_);
  params_00._M_len = in_R8;
  params_00._M_array = (iterator)0x1;
  FOTerm::functor((FOTerm *)((long)&fa.name.field_2 + 8),(FOTerm *)local_90,&local_1f0,params_00);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&local_1f0);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"h","");
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&local_1f0,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)local_130);
  local_1f0.field_2._8_4_ =
       Y.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_;
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,Y._24_8_,Y.name._M_dataplus._M_p + Y._24_8_);
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            (&local_1b0,(vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&a.name.field_2 + 8));
  local_198 = fa.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_;
  plVar3 = local_180;
  local_190[0] = plVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_190,fa._24_8_,fa.name._M_dataplus._M_p + fa._24_8_);
  params_01._M_len = in_R8;
  params_01._M_array = (iterator)0x2;
  FOTerm::functor((FOTerm *)((long)&fX.name.field_2 + 8),(FOTerm *)local_70,&local_1f0,params_01);
  lVar2 = -0x80;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
              ((vector<FOTerm,_std::allocator<FOTerm>_> *)(plVar3 + -6));
    plVar3 = plVar3 + -8;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  local_50._M_p = (pointer)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"p","");
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)&local_1f0,
             (vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&fa.name.field_2 + 8));
  local_1f0.field_2._8_4_ =
       fX.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage._0_4_;
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,fX._24_8_,fX.name._M_dataplus._M_p + fX._24_8_);
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            (&local_1b0,(vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&fX.name.field_2 + 8));
  local_198 = hYfa.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_;
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_190,hYfa._24_8_,hYfa.name._M_dataplus._M_p + hYfa._24_8_);
  std::vector<FOTerm,_std::allocator<FOTerm>_>::vector
            (&local_170,(vector<FOTerm,_std::allocator<FOTerm>_> *)local_130);
  local_158 = Y.params.super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_;
  plVar3 = local_140;
  local_150[0] = plVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_150,Y._24_8_,Y.name._M_dataplus._M_p + Y._24_8_);
  params_02._M_len = in_R8;
  params_02._M_array = (iterator)0x3;
  FOTerm::functor(in_RDI,(FOTerm *)&local_50,&local_1f0,params_02);
  lVar2 = -0xc0;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
              ((vector<FOTerm,_std::allocator<FOTerm>_> *)(plVar3 + -6));
    plVar3 = plVar3 + -8;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if ((size_type *)hYfa._24_8_ != &hYfa.name._M_string_length) {
    operator_delete((void *)hYfa._24_8_,hYfa.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&fX.name.field_2 + 8));
  if ((size_type *)fX._24_8_ != &fX.name._M_string_length) {
    operator_delete((void *)fX._24_8_,fX.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&fa.name.field_2 + 8));
  if ((size_type *)fa._24_8_ != &fa.name._M_string_length) {
    operator_delete((void *)fa._24_8_,fa.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&a.name.field_2 + 8));
  if ((size_type *)a._24_8_ != &a.name._M_string_length) {
    operator_delete((void *)a._24_8_,a.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)((long)&X.name.field_2 + 8));
  if ((size_type *)Y._24_8_ != &Y.name._M_string_length) {
    operator_delete((void *)Y._24_8_,Y.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_130);
  if ((size_type *)X._24_8_ != &X.name._M_string_length) {
    operator_delete((void *)X._24_8_,X.name._M_string_length + 1);
  }
  std::vector<FOTerm,_std::allocator<FOTerm>_>::~vector
            ((vector<FOTerm,_std::allocator<FOTerm>_> *)local_350);
  return in_RDI;
}

Assistant:

FOTerm test_create_program() {
    FOTerm X = FOTerm::variable("X");
    FOTerm Y = FOTerm::variable("Y");
    FOTerm a = FOTerm::functor("a", {});
    FOTerm fa = FOTerm::functor("f", {a});
    FOTerm fX = FOTerm::functor("f", {X});
    FOTerm hYfa = FOTerm::functor("h", {Y, fa});
    return FOTerm::functor("p", {fX, hYfa, Y});
}